

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_button_text_symbol
               (nk_command_buffer *out,nk_rect *bounds,nk_rect *label,nk_rect *symbol,nk_flags state
               ,nk_style_button *style,char *str,int len,nk_symbol_type type,nk_user_font *font)

{
  nk_style_item *pnVar1;
  nk_style_item *background;
  nk_text text;
  nk_color sym;
  nk_style_button *style_local;
  nk_flags state_local;
  nk_rect *symbol_local;
  nk_rect *label_local;
  nk_rect *bounds_local;
  nk_command_buffer *out_local;
  
  pnVar1 = nk_draw_button(out,bounds,state,style);
  if (pnVar1->type == NK_STYLE_ITEM_COLOR) {
    text.padding.x = *(float *)&(pnVar1->data).color;
  }
  else {
    text.padding.x = *(float *)&style->text_background;
  }
  if ((state & 0x10) == 0) {
    if ((state & 0x20) == 0) {
      text.text = style->text_normal;
      text.padding.y = *(float *)&style->text_normal;
    }
    else {
      text.text = style->text_active;
      text.padding.y = *(float *)&style->text_active;
    }
  }
  else {
    text.text = style->text_hover;
    text.padding.y = *(float *)&style->text_hover;
  }
  background = (nk_style_item *)nk_vec2(0.0,0.0);
  nk_draw_symbol(out,type,*symbol,style->text_background,text.text,0.0,font);
  nk_widget_text(out,*label,str,len,(nk_text *)&background,0x12,font);
  return;
}

Assistant:

NK_LIB void
nk_draw_button_text_symbol(struct nk_command_buffer *out,
    const struct nk_rect *bounds, const struct nk_rect *label,
    const struct nk_rect *symbol, nk_flags state, const struct nk_style_button *style,
    const char *str, int len, enum nk_symbol_type type,
    const struct nk_user_font *font)
{
    struct nk_color sym;
    struct nk_text text;
    const struct nk_style_item *background;

    /* select correct background colors/images */
    background = nk_draw_button(out, bounds, state, style);
    if (background->type == NK_STYLE_ITEM_COLOR)
        text.background = background->data.color;
    else text.background = style->text_background;

    /* select correct text colors */
    if (state & NK_WIDGET_STATE_HOVER) {
        sym = style->text_hover;
        text.text = style->text_hover;
    } else if (state & NK_WIDGET_STATE_ACTIVED) {
        sym = style->text_active;
        text.text = style->text_active;
    } else {
        sym = style->text_normal;
        text.text = style->text_normal;
    }

    text.padding = nk_vec2(0,0);
    nk_draw_symbol(out, type, *symbol, style->text_background, sym, 0, font);
    nk_widget_text(out, *label, str, len, &text, NK_TEXT_CENTERED, font);
}